

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl::setDefaultStateParams(Private_Impl *this)

{
  memset(&this->State,0,0xc0);
  (this->State).framerate = 0x1e;
  (this->State).width = 0x500;
  (this->State).height = 0x3c0;
  (this->State).sharpness = 0;
  (this->State).contrast = 0;
  (this->State).brightness = 0x32;
  (this->State).saturation = 0;
  (this->State).ISO = 400;
  (this->State).videoStabilisation = false;
  (this->State).rpc_exposureMeterMode = RASPICAM_METERING_AVERAGE;
  (this->State).rpc_awbMode = RASPICAM_AWB_AUTO;
  (this->State).rpc_imageEffect = RASPICAM_IMAGE_EFFECT_NONE;
  (this->State).colourEffects.enable = 0;
  (this->State).colourEffects.u = 0x80;
  *(undefined8 *)&(this->State).colourEffects.v = 0x80;
  (this->State).hflip = 0;
  (this->State).vflip = 0;
  (this->State).roi.x = 0.0;
  (this->State).roi.y = 0.0;
  (this->State).roi.w = 1.0;
  (this->State).roi.h = 1.0;
  (this->State).exposureCompensation = 0;
  (this->State).shutterSpeed = 0;
  (this->State).captureFtm = RASPICAM_FORMAT_RGB;
  (this->State).rpc_exposureMode = RASPICAM_EXPOSURE_AUTO;
  (this->State).awbg_red = 1.0;
  (this->State).awbg_blue = 1.0;
  return;
}

Assistant:

void Private_Impl::setDefaultStateParams() {

            // Default everything to zero
            memset ( &State, 0, sizeof ( RASPIVID_STATE ) );
            State.framerate 		= 30;
            State.width 			= 1280;      // use a multiple of 320 (640, 1280)
            State.height 			= 960;		// use a multiple of 240 (480, 960)
            State.sharpness = 0;
            State.contrast = 0;
            State.brightness = 50;
            State.saturation = 0;
            State.ISO = 400;
            State.videoStabilisation = false;
            State.exposureCompensation = 0;
            State.captureFtm=RASPICAM_FORMAT_RGB;
            State.rpc_exposureMode = RASPICAM_EXPOSURE_AUTO;
            State.rpc_exposureMeterMode = RASPICAM_METERING_AVERAGE;
            State.rpc_awbMode = RASPICAM_AWB_AUTO;
            State.rpc_imageEffect = RASPICAM_IMAGE_EFFECT_NONE;
            State.colourEffects.enable = 0;
            State.colourEffects.u = 128;
            State.colourEffects.v = 128;
            State.rotation = 0;
            State.hflip = State.vflip = 0;
            State.roi.x = State.roi.y = 0.0;
            State.roi.w = State.roi.h = 1.0;
            State.shutterSpeed=0;//auto
            State.awbg_red=1.0;
            State.awbg_blue=1.0;

        }